

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O0

void anon_unknown.dwarf_3336::Test_TemplateTestUtilTest_GetIncludeAndSectionDictionaries::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  int iVar19;
  reference ppTVar20;
  char *pcVar21;
  TemplateString local_5a8;
  TemplateString local_588;
  TemplateString local_568;
  TemplateDictionaryPeer local_548;
  TemplateDictionaryPeer section_peer1;
  TemplateDictionaryPeer local_520;
  TemplateDictionaryPeer section_peer0;
  undefined1 local_4f8 [8];
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  section_dicts_1;
  TemplateString local_4c0;
  TemplateString local_4a0;
  TemplateDictionaryPeer local_480;
  TemplateDictionaryPeer include_peer1;
  TemplateDictionaryPeer local_458;
  TemplateDictionaryPeer include_peer0;
  undefined1 local_430 [8];
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  dicts_1;
  TemplateDictionaryPeer peer_2;
  size_t sStack_408;
  undefined8 local_400;
  TemplateId TStack_3f8;
  TemplateString local_3f0;
  TemplateString local_3d0;
  TemplateString local_3b0;
  TemplateString local_390;
  TemplateString local_370;
  TemplateString local_350;
  TemplateString local_330;
  TemplateString local_310;
  TemplateString local_2f0;
  TemplateString local_2d0;
  TemplateString local_2b0;
  TemplateString local_290;
  TemplateDictionaryPeer local_270;
  TemplateDictionaryPeer section_peer;
  undefined1 local_248 [8];
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  section_dicts;
  TemplateDictionaryPeer local_210;
  TemplateDictionaryPeer include_peer;
  undefined1 local_1e8 [8];
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  include_dicts;
  TemplateDictionaryPeer peer_1;
  size_t sStack_1c0;
  undefined8 local_1b8;
  TemplateId TStack_1b0;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  undefined1 local_c8 [8];
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  dicts;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&peer,"test_GetIncludeAndSectionDictionaries");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            *)local_c8);
  ctemplate::TemplateString::TemplateString(&local_e8,"SECTION");
  iVar19 = ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries
                     (&local_a0,&local_e8,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_c8);
  if (iVar19 != 0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","0","==",
            "peer.GetIncludeDictionaries(\"SECTION\", &dicts)");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_108,"SECTION");
  iVar19 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                     (&local_a0,&local_108,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_c8);
  if (iVar19 != 0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","0","==",
            "peer.GetSectionDictionaries(\"SECTION\", &dicts)");
    exit(1);
  }
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::~vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             *)local_c8);
  ctemplate::TemplateString::TemplateString(&local_128,"SECTION");
  TVar1.length_ = local_128.length_;
  TVar1.ptr_ = local_128.ptr_;
  TVar1.is_immutable_ = local_128.is_immutable_;
  TVar1._17_7_ = local_128._17_7_;
  TVar1.id_ = local_128.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  ctemplate::TemplateString::TemplateString(&local_148,"SECTION_VALUE");
  ctemplate::TemplateString::TemplateString(&local_168,"0");
  TVar2.length_ = local_148.length_;
  TVar2.ptr_ = local_148.ptr_;
  TVar2.is_immutable_ = local_148.is_immutable_;
  TVar2._17_7_ = local_148._17_7_;
  TVar2.id_ = local_148.id_;
  TVar13.length_ = local_168.length_;
  TVar13.ptr_ = local_168.ptr_;
  TVar13.is_immutable_ = local_168.is_immutable_;
  TVar13._17_7_ = local_168._17_7_;
  TVar13.id_ = local_168.id_;
  ctemplate::TemplateDictionary::SetValue(TVar2,TVar13);
  ctemplate::TemplateString::TemplateString(&local_188,"SECTION");
  TVar3.length_ = local_188.length_;
  TVar3.ptr_ = local_188.ptr_;
  TVar3.is_immutable_ = local_188.is_immutable_;
  TVar3._17_7_ = local_188._17_7_;
  TVar3.id_ = local_188.id_;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar3);
  ctemplate::TemplateString::TemplateString(&local_1a8,"SECTION_VALUE");
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer_1,"1");
  TVar4.length_ = local_1a8.length_;
  TVar4.ptr_ = local_1a8.ptr_;
  TVar4.is_immutable_ = local_1a8.is_immutable_;
  TVar4._17_7_ = local_1a8._17_7_;
  TVar4.id_ = local_1a8.id_;
  TVar14.length_ = sStack_1c0;
  TVar14.ptr_ = (char *)peer_1.dict_;
  TVar14._16_8_ = local_1b8;
  TVar14.id_ = TStack_1b0;
  ctemplate::TemplateDictionary::SetValue(TVar4,TVar14);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer
            ((TemplateDictionaryPeer *)
             &include_dicts.
              super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_78);
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            *)local_1e8);
  ctemplate::TemplateString::TemplateString((TemplateString *)&include_peer,"SECTION");
  iVar19 = ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries
                     ((TemplateDictionaryPeer *)
                      &include_dicts.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (TemplateString *)&include_peer,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_1e8);
  if (iVar19 != 1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","1","==",
            "peer.GetIncludeDictionaries(\"SECTION\", &include_dicts)");
    exit(1);
  }
  ppTVar20 = std::
             vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             ::operator[]((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                           *)local_1e8,0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_210,*ppTVar20);
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)
             &section_dicts.
              super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"SECTION_VALUE");
  pcVar21 = ctemplate::TemplateDictionaryPeer::GetSectionValue
                      (&local_210,
                       (TemplateString *)
                       &section_dicts.
                        super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar19 = strcmp("0",pcVar21);
  if (iVar19 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(\"0\", include_peer.GetSectionValue(\"SECTION_VALUE\")) == 0");
    exit(1);
  }
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            *)local_248);
  ctemplate::TemplateString::TemplateString((TemplateString *)&section_peer,"SECTION");
  iVar19 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                     ((TemplateDictionaryPeer *)
                      &include_dicts.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (TemplateString *)&section_peer,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_248);
  if (iVar19 != 1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","1","==",
            "peer.GetSectionDictionaries(\"SECTION\", &section_dicts)");
    exit(1);
  }
  ppTVar20 = std::
             vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             ::operator[]((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                           *)local_248,0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_270,*ppTVar20);
  ctemplate::TemplateString::TemplateString(&local_290,"SECTION_VALUE");
  pcVar21 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_290);
  iVar19 = strcmp("1",pcVar21);
  if (iVar19 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(\"1\", section_peer.GetSectionValue(\"SECTION_VALUE\")) == 0");
    exit(1);
  }
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::~vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             *)local_248);
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::~vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             *)local_1e8);
  ctemplate::TemplateString::TemplateString(&local_2b0,"SECTION");
  TVar5.length_ = local_2b0.length_;
  TVar5.ptr_ = local_2b0.ptr_;
  TVar5.is_immutable_ = local_2b0.is_immutable_;
  TVar5._17_7_ = local_2b0._17_7_;
  TVar5.id_ = local_2b0.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar5);
  ctemplate::TemplateString::TemplateString(&local_2d0,"SECTION_VALUE");
  ctemplate::TemplateString::TemplateString(&local_2f0,"2");
  TVar6.length_ = local_2d0.length_;
  TVar6.ptr_ = local_2d0.ptr_;
  TVar6.is_immutable_ = local_2d0.is_immutable_;
  TVar6._17_7_ = local_2d0._17_7_;
  TVar6.id_ = local_2d0.id_;
  TVar15.length_ = local_2f0.length_;
  TVar15.ptr_ = local_2f0.ptr_;
  TVar15.is_immutable_ = local_2f0.is_immutable_;
  TVar15._17_7_ = local_2f0._17_7_;
  TVar15.id_ = local_2f0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar6,TVar15);
  ctemplate::TemplateString::TemplateString(&local_310,"ANOTHER_SECTION");
  TVar7.length_ = local_310.length_;
  TVar7.ptr_ = local_310.ptr_;
  TVar7.is_immutable_ = local_310.is_immutable_;
  TVar7._17_7_ = local_310._17_7_;
  TVar7.id_ = local_310.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar7);
  ctemplate::TemplateString::TemplateString(&local_330,"ANOTHER_VALUE");
  ctemplate::TemplateString::TemplateString(&local_350,"3");
  TVar8.length_ = local_330.length_;
  TVar8.ptr_ = local_330.ptr_;
  TVar8.is_immutable_ = local_330.is_immutable_;
  TVar8._17_7_ = local_330._17_7_;
  TVar8.id_ = local_330.id_;
  TVar16.length_ = local_350.length_;
  TVar16.ptr_ = local_350.ptr_;
  TVar16.is_immutable_ = local_350.is_immutable_;
  TVar16._17_7_ = local_350._17_7_;
  TVar16.id_ = local_350.id_;
  ctemplate::TemplateDictionary::SetValue(TVar8,TVar16);
  ctemplate::TemplateString::TemplateString(&local_370,"SECTION");
  TVar9.length_ = local_370.length_;
  TVar9.ptr_ = local_370.ptr_;
  TVar9.is_immutable_ = local_370.is_immutable_;
  TVar9._17_7_ = local_370._17_7_;
  TVar9.id_ = local_370.id_;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar9);
  ctemplate::TemplateString::TemplateString(&local_390,"SECTION_VALUE");
  ctemplate::TemplateString::TemplateString(&local_3b0,"4");
  TVar10.length_ = local_390.length_;
  TVar10.ptr_ = local_390.ptr_;
  TVar10.is_immutable_ = local_390.is_immutable_;
  TVar10._17_7_ = local_390._17_7_;
  TVar10.id_ = local_390.id_;
  TVar17.length_ = local_3b0.length_;
  TVar17.ptr_ = local_3b0.ptr_;
  TVar17.is_immutable_ = local_3b0.is_immutable_;
  TVar17._17_7_ = local_3b0._17_7_;
  TVar17.id_ = local_3b0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar10,TVar17);
  ctemplate::TemplateString::TemplateString(&local_3d0,"ONE_MORE_SECTION");
  TVar11.length_ = local_3d0.length_;
  TVar11.ptr_ = local_3d0.ptr_;
  TVar11.is_immutable_ = local_3d0.is_immutable_;
  TVar11._17_7_ = local_3d0._17_7_;
  TVar11.id_ = local_3d0.id_;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar11);
  ctemplate::TemplateString::TemplateString(&local_3f0,"ANOTHER_VALUE");
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer_2,"5");
  TVar12.length_ = local_3f0.length_;
  TVar12.ptr_ = local_3f0.ptr_;
  TVar12.is_immutable_ = local_3f0.is_immutable_;
  TVar12._17_7_ = local_3f0._17_7_;
  TVar12.id_ = local_3f0.id_;
  TVar18.length_ = sStack_408;
  TVar18.ptr_ = (char *)peer_2.dict_;
  TVar18._16_8_ = local_400;
  TVar18.id_ = TStack_3f8;
  ctemplate::TemplateDictionary::SetValue(TVar12,TVar18);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer
            ((TemplateDictionaryPeer *)
             &dicts_1.
              super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_78);
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            *)local_430);
  ctemplate::TemplateString::TemplateString((TemplateString *)&include_peer0,"SECTION");
  iVar19 = ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries
                     ((TemplateDictionaryPeer *)
                      &dicts_1.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (TemplateString *)&include_peer0,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_430);
  if (iVar19 != 2) {
    fprintf(_stderr,"Check failed: %s %s %s\n","2","==",
            "peer.GetIncludeDictionaries(\"SECTION\", &dicts)");
    exit(1);
  }
  ppTVar20 = std::
             vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             ::operator[]((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                           *)local_430,0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_458,*ppTVar20);
  ctemplate::TemplateString::TemplateString((TemplateString *)&include_peer1,"SECTION_VALUE");
  pcVar21 = ctemplate::TemplateDictionaryPeer::GetSectionValue
                      (&local_458,(TemplateString *)&include_peer1);
  iVar19 = strcmp("0",pcVar21);
  if (iVar19 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(\"0\", include_peer0.GetSectionValue(\"SECTION_VALUE\")) == 0");
    exit(1);
  }
  ppTVar20 = std::
             vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             ::operator[]((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                           *)local_430,1);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_480,*ppTVar20);
  ctemplate::TemplateString::TemplateString(&local_4a0,"SECTION_VALUE");
  pcVar21 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_480,&local_4a0);
  iVar19 = strcmp("2",pcVar21);
  if (iVar19 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(\"2\", include_peer1.GetSectionValue(\"SECTION_VALUE\")) == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_4c0,"ANOTHER_SECTION");
  iVar19 = ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries
                     ((TemplateDictionaryPeer *)
                      &dicts_1.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4c0,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_430);
  if (iVar19 != 1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","1","==",
            "peer.GetIncludeDictionaries(\"ANOTHER_SECTION\", &dicts)");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)
             &section_dicts_1.
              super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"ONE_MORE_SECTION");
  iVar19 = ctemplate::TemplateDictionaryPeer::GetIncludeDictionaries
                     ((TemplateDictionaryPeer *)
                      &dicts_1.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (TemplateString *)
                      &section_dicts_1.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_430);
  if (iVar19 != 0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","0","==",
            "peer.GetIncludeDictionaries(\"ONE_MORE_SECTION\", &dicts)");
    exit(1);
  }
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            *)local_4f8);
  ctemplate::TemplateString::TemplateString((TemplateString *)&section_peer0,"SECTION");
  iVar19 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                     ((TemplateDictionaryPeer *)
                      &dicts_1.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (TemplateString *)&section_peer0,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_4f8);
  if (iVar19 != 2) {
    fprintf(_stderr,"Check failed: %s %s %s\n","2","==",
            "peer.GetSectionDictionaries(\"SECTION\", &section_dicts)");
    exit(1);
  }
  ppTVar20 = std::
             vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             ::operator[]((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                           *)local_4f8,0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_520,*ppTVar20);
  ctemplate::TemplateString::TemplateString((TemplateString *)&section_peer1,"SECTION_VALUE");
  pcVar21 = ctemplate::TemplateDictionaryPeer::GetSectionValue
                      (&local_520,(TemplateString *)&section_peer1);
  iVar19 = strcmp("1",pcVar21);
  if (iVar19 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(\"1\", section_peer0.GetSectionValue(\"SECTION_VALUE\")) == 0");
    exit(1);
  }
  ppTVar20 = std::
             vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
             ::operator[]((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                           *)local_4f8,1);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_548,*ppTVar20);
  ctemplate::TemplateString::TemplateString(&local_568,"SECTION_VALUE");
  pcVar21 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_548,&local_568);
  iVar19 = strcmp("4",pcVar21);
  if (iVar19 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(\"4\", section_peer1.GetSectionValue(\"SECTION_VALUE\")) == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_588,"ANOTHER_SECTION");
  iVar19 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                     ((TemplateDictionaryPeer *)
                      &dicts_1.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_588,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_430);
  if (iVar19 != 0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","0","==",
            "peer.GetSectionDictionaries(\"ANOTHER_SECTION\", &dicts)");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_5a8,"ONE_MORE_SECTION");
  iVar19 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                     ((TemplateDictionaryPeer *)
                      &dicts_1.
                       super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_5a8,
                      (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                       *)local_430);
  if (iVar19 == 1) {
    std::
    vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
    ::~vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
               *)local_4f8);
    std::
    vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
    ::~vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
               *)local_430);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  fprintf(_stderr,"Check failed: %s %s %s\n","1","==",
          "peer.GetSectionDictionaries(\"ONE_MORE_SECTION\", &dicts)");
  exit(1);
}

Assistant:

TEST(TemplateTestUtilTest, GetIncludeAndSectionDictionaries) {
  TemplateDictionary dict("test_GetIncludeAndSectionDictionaries");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> dicts;
    EXPECT_EQ(0, peer.GetIncludeDictionaries("SECTION", &dicts));
    EXPECT_EQ(0, peer.GetSectionDictionaries("SECTION", &dicts));
  }

  dict.AddIncludeDictionary("SECTION")->SetValue("SECTION_VALUE", "0");
  dict.AddSectionDictionary("SECTION")->SetValue("SECTION_VALUE", "1");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> include_dicts;
    ASSERT_EQ(1, peer.GetIncludeDictionaries("SECTION", &include_dicts));

    TemplateDictionaryPeer include_peer(include_dicts[0]);
    EXPECT_STREQ("0", include_peer.GetSectionValue("SECTION_VALUE"));

    vector<const TemplateDictionary*> section_dicts;
    ASSERT_EQ(1, peer.GetSectionDictionaries("SECTION", &section_dicts));

    TemplateDictionaryPeer section_peer(section_dicts[0]);
    EXPECT_STREQ("1", section_peer.GetSectionValue("SECTION_VALUE"));
  }

  dict.AddIncludeDictionary("SECTION")->SetValue("SECTION_VALUE", "2");
  dict.AddIncludeDictionary("ANOTHER_SECTION")->SetValue("ANOTHER_VALUE", "3");

  dict.AddSectionDictionary("SECTION")->SetValue("SECTION_VALUE", "4");
  dict.AddSectionDictionary("ONE_MORE_SECTION")->SetValue("ANOTHER_VALUE", "5");

  {
    TemplateDictionaryPeer peer(&dict);
    vector<const TemplateDictionary*> dicts;
    ASSERT_EQ(2, peer.GetIncludeDictionaries("SECTION", &dicts));

    TemplateDictionaryPeer include_peer0(dicts[0]);
    EXPECT_STREQ("0", include_peer0.GetSectionValue("SECTION_VALUE"));

    TemplateDictionaryPeer include_peer1(dicts[1]);
    EXPECT_STREQ("2", include_peer1.GetSectionValue("SECTION_VALUE"));

    EXPECT_EQ(1, peer.GetIncludeDictionaries("ANOTHER_SECTION", &dicts));
    EXPECT_EQ(0, peer.GetIncludeDictionaries("ONE_MORE_SECTION", &dicts));

    vector<const TemplateDictionary*> section_dicts;
    ASSERT_EQ(2, peer.GetSectionDictionaries("SECTION", &section_dicts));

    TemplateDictionaryPeer section_peer0(section_dicts[0]);
    EXPECT_STREQ("1", section_peer0.GetSectionValue("SECTION_VALUE"));

    TemplateDictionaryPeer section_peer1(section_dicts[1]);
    EXPECT_STREQ("4", section_peer1.GetSectionValue("SECTION_VALUE"));

    EXPECT_EQ(0, peer.GetSectionDictionaries("ANOTHER_SECTION", &dicts));
    EXPECT_EQ(1, peer.GetSectionDictionaries("ONE_MORE_SECTION", &dicts));
  }
}